

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O1

void psh_hint_table_find_strong_points
               (PSH_Hint_Table table,PSH_Point_conflict point,FT_UInt count,FT_Int threshold,
               PSH_Dir major_dir)

{
  uint uVar1;
  PSH_Hint_conflict *ppPVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  PSH_Dir PVar9;
  long lVar10;
  PSH_Hint_conflict pPVar11;
  ulong uVar12;
  
  if (count == 0) {
    return;
  }
  ppPVar2 = table->sort;
  uVar1 = table->num_hints;
  uVar6 = (ulong)uVar1;
  lVar4 = (long)threshold;
  lVar7 = -lVar4;
LAB_0023d689:
  uVar5 = point->flags2;
  if ((uVar5 & 0x10) == 0) {
    lVar3 = point->org_u;
    PVar9 = (point->dir_out | point->dir_in) & major_dir;
    if ((PVar9 & (PSH_DIR_RIGHT|PSH_DIR_DOWN)) == PSH_DIR_NONE) {
      if ((PVar9 & (PSH_DIR_LEFT|PSH_DIR_UP)) == PSH_DIR_NONE) {
        if ((uVar5 & 0x40) != 0) {
          if ((uVar5 & (uint)(major_dir != PSH_DIR_HORIZONTAL) * 0x80 + 0x80) == 0) {
            if ((uVar5 & (uint)(major_dir == PSH_DIR_HORIZONTAL) * 0x80 + 0x80) != 0 && uVar1 != 0)
            {
              lVar10 = 0;
              do {
                pPVar11 = ppPVar2[lVar10];
                lVar8 = lVar3 - ((long)pPVar11->org_len + (long)pPVar11->org_pos);
                if ((lVar8 != lVar7 && SBORROW8(lVar8,lVar7) == lVar8 + lVar4 < 0) && lVar8 < lVar4)
                {
                  uVar5 = 0x410;
                  goto LAB_0023d7df;
                }
                lVar10 = lVar10 + 1;
              } while (uVar1 != (uint)lVar10);
            }
          }
          else if (uVar6 != 0) {
            lVar10 = 0;
LAB_0023d747:
            pPVar11 = ppPVar2[lVar10];
            lVar8 = lVar3 - pPVar11->org_pos;
            if ((lVar8 == lVar7 || SBORROW8(lVar8,lVar7) != lVar8 + lVar4 < 0) || lVar4 <= lVar8)
            goto code_r0x0023d767;
            uVar5 = 0x210;
LAB_0023d7df:
            point->hint = pPVar11;
            point->flags2 = point->flags2 | uVar5;
          }
LAB_0023d7e6:
          if (point->hint == (PSH_Hint_conflict)0x0 && uVar1 != 0) {
            uVar12 = 0;
            do {
              pPVar11 = ppPVar2[uVar12];
              if ((pPVar11->org_pos <= lVar3) && (lVar3 <= pPVar11->org_pos + pPVar11->org_len))
              goto LAB_0023d778;
              uVar12 = uVar12 + 1;
            } while (uVar6 != uVar12);
          }
        }
      }
      else if (uVar6 != 0) {
        lVar10 = 0;
        do {
          pPVar11 = ppPVar2[lVar10];
          lVar8 = lVar3 - ((long)pPVar11->org_len + (long)pPVar11->org_pos);
          if ((lVar8 != lVar7 && SBORROW8(lVar8,lVar7) == lVar8 + lVar4 < 0) && lVar8 < lVar4) {
            point->flags2 = point->flags2 | 0x410;
            goto LAB_0023d778;
          }
          lVar10 = lVar10 + 1;
        } while (uVar1 != (uint)lVar10);
      }
    }
    else if (uVar6 != 0) {
      lVar10 = 0;
      do {
        pPVar11 = ppPVar2[lVar10];
        lVar8 = lVar3 - pPVar11->org_pos;
        if ((lVar8 != lVar7 && SBORROW8(lVar8,lVar7) == lVar8 + lVar4 < 0) && lVar8 < lVar4) {
          point->flags2 = point->flags2 | 0x210;
          goto LAB_0023d778;
        }
        lVar10 = lVar10 + 1;
      } while (uVar1 != (uint)lVar10);
    }
  }
  goto LAB_0023d77c;
code_r0x0023d767:
  lVar10 = lVar10 + 1;
  if (uVar1 == (uint)lVar10) goto LAB_0023d7e6;
  goto LAB_0023d747;
LAB_0023d778:
  point->hint = pPVar11;
LAB_0023d77c:
  point = point + 1;
  count = count - 1;
  if (count == 0) {
    return;
  }
  goto LAB_0023d689;
}

Assistant:

static void
  psh_hint_table_find_strong_points( PSH_Hint_Table  table,
                                     PSH_Point       point,
                                     FT_UInt         count,
                                     FT_Int          threshold,
                                     PSH_Dir         major_dir )
  {
    PSH_Hint*  sort      = table->sort;
    FT_UInt    num_hints = table->num_hints;


    for ( ; count > 0; count--, point++ )
    {
      PSH_Dir  point_dir;
      FT_Pos   org_u = point->org_u;


      if ( psh_point_is_strong( point ) )
        continue;

      point_dir =
        (PSH_Dir)( ( point->dir_in | point->dir_out ) & major_dir );

      if ( point_dir & ( PSH_DIR_DOWN | PSH_DIR_RIGHT ) )
      {
        FT_UInt  nn;


        for ( nn = 0; nn < num_hints; nn++ )
        {
          PSH_Hint  hint = sort[nn];
          FT_Pos    d    = org_u - hint->org_pos;


          if ( d < threshold && -d < threshold )
          {
            psh_point_set_strong( point );
            point->flags2 |= PSH_POINT_EDGE_MIN;
            point->hint    = hint;
            break;
          }
        }
      }
      else if ( point_dir & ( PSH_DIR_UP | PSH_DIR_LEFT ) )
      {
        FT_UInt  nn;


        for ( nn = 0; nn < num_hints; nn++ )
        {
          PSH_Hint  hint = sort[nn];
          FT_Pos    d    = org_u - hint->org_pos - hint->org_len;


          if ( d < threshold && -d < threshold )
          {
            psh_point_set_strong( point );
            point->flags2 |= PSH_POINT_EDGE_MAX;
            point->hint    = hint;
            break;
          }
        }
      }

#if 1
      else if ( psh_point_is_extremum( point ) )
      {
        /* treat extrema as special cases for stem edge alignment */
        FT_UInt  nn, min_flag, max_flag;


        if ( major_dir == PSH_DIR_HORIZONTAL )
        {
          min_flag = PSH_POINT_POSITIVE;
          max_flag = PSH_POINT_NEGATIVE;
        }
        else
        {
          min_flag = PSH_POINT_NEGATIVE;
          max_flag = PSH_POINT_POSITIVE;
        }

        if ( point->flags2 & min_flag )
        {
          for ( nn = 0; nn < num_hints; nn++ )
          {
            PSH_Hint  hint = sort[nn];
            FT_Pos    d    = org_u - hint->org_pos;


            if ( d < threshold && -d < threshold )
            {
              point->flags2 |= PSH_POINT_EDGE_MIN;
              point->hint    = hint;
              psh_point_set_strong( point );
              break;
            }
          }
        }
        else if ( point->flags2 & max_flag )
        {
          for ( nn = 0; nn < num_hints; nn++ )
          {
            PSH_Hint  hint = sort[nn];
            FT_Pos    d    = org_u - hint->org_pos - hint->org_len;


            if ( d < threshold && -d < threshold )
            {
              point->flags2 |= PSH_POINT_EDGE_MAX;
              point->hint    = hint;
              psh_point_set_strong( point );
              break;
            }
          }
        }

        if ( !point->hint )
        {
          for ( nn = 0; nn < num_hints; nn++ )
          {
            PSH_Hint  hint = sort[nn];


            if ( org_u >=          hint->org_pos                  &&
                 org_u <= ADD_INT( hint->org_pos, hint->org_len ) )
            {
              point->hint = hint;
              break;
            }
          }
        }
      }

#endif /* 1 */
    }
  }